

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O2

void __thiscall
t_st_generator::st_method(t_st_generator *this,ostream *out,string *cls,string *name)

{
  allocator local_79;
  string local_78;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,(string *)cls);
  std::__cxx11::string::string((string *)&local_58,(string *)name);
  std::__cxx11::string::string((string *)&local_78,"as yet uncategorized",&local_79);
  st_method(this,out,&local_38,&local_58,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void t_st_generator::st_method(std::ostream& out, string cls, string name) {
  st_method(out, cls, name, "as yet uncategorized");
}